

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::threadWaiting
          (BeagleCPUImpl<float,_1,_0> *this,threadData *tData)

{
  _Elt_pointer ppVar1;
  char cVar2;
  undefined8 uVar3;
  packaged_task<void_()> j;
  unique_lock<std::mutex> l;
  packaged_task<void_()> local_48;
  unique_lock<std::mutex> local_38;
  
  local_38._M_device = &tData->m;
  local_38._M_owns = false;
  do {
    std::unique_lock<std::mutex>::lock(&local_38);
    cVar2 = tData->stop;
    if ((bool)cVar2 == false) {
      do {
        if ((tData->jobs).c.
            super__Deque_base<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
            (tData->jobs).c.
            super__Deque_base<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur) break;
        std::condition_variable::wait((unique_lock *)&tData->cv);
        cVar2 = tData->stop;
      } while ((bool)cVar2 != true);
    }
    if (cVar2 != '\0') {
      std::unique_lock<std::mutex>::~unique_lock(&local_38);
      return;
    }
    ppVar1 = (tData->jobs).c.
             super__Deque_base<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_48._M_state.
    super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (ppVar1->_M_state).
             super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (ppVar1->_M_state).
    super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_48._M_state.
    super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (ppVar1->_M_state).
         super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    (ppVar1->_M_state).
    super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::deque<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>::
    pop_front(&(tData->jobs).c);
    std::unique_lock<std::mutex>::unlock(&local_38);
    if (local_48._M_state.
        super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (element_type *)0x0) {
      uVar3 = std::__throw_future_error(3);
      std::packaged_task<void_()>::~packaged_task(&local_48);
      std::unique_lock<std::mutex>::~unique_lock(&local_38);
      _Unwind_Resume(uVar3);
    }
    (*((local_48._M_state.
        super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr)->super__State_base)._vptr__State_baseV2[4])();
    std::packaged_task<void_()>::~packaged_task(&local_48);
  } while( true );
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::threadWaiting(threadData* tData)
{
    std::unique_lock<std::mutex> l(tData->m, std::defer_lock);
    while (true)
    {
        l.lock();

        // Wait until the queue won't be empty or stop is signaled
        tData->cv.wait(l, [tData] () {
            return (tData->stop || !tData->jobs.empty());
            });

        // Stop was signaled, let's exit the thread
        if (tData->stop) { return; }

        // Pop one task from the queue...
        std::packaged_task<void()> j = std::move(tData->jobs.front());
        tData->jobs.pop();

        l.unlock();

        // Execute the task!
        j();
    }
}